

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_compressionParameters cParams;
  uint uVar1;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  void *in_R9;
  long in_stack_00000008;
  ulong in_stack_00000010;
  size_t err_code_1;
  size_t dictID;
  size_t err_code;
  ZSTD_CDict *in_stack_00000050;
  ZSTD_buffered_policy_e in_stack_00000058;
  ZSTD_compResetPolicy_e in_stack_0000005c;
  size_t in_stack_00000060;
  U64 in_stack_00000068;
  size_t dictContentSize;
  uint in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  ZSTD_cwksp *in_stack_ffffffffffffff70;
  ZSTD_strategy ZVar2;
  undefined4 uVar3;
  ZSTD_matchState_t *in_stack_ffffffffffffff80;
  ZSTD_compressedBlockState_t *in_stack_ffffffffffffff88;
  size_t sVar4;
  ZSTD_dictContentType_e dictContentType_00;
  ZSTD_dictTableLoadMethod_e dtlm_00;
  undefined8 uVar5;
  size_t local_18;
  
  if (in_R9 == (void *)0x0) {
    ZVar2 = (ZSTD_strategy)in_RDX;
    uVar3 = (undefined4)((ulong)in_RDX >> 0x20);
  }
  else {
    ZVar2 = (ZSTD_strategy)*(undefined8 *)((long)in_R9 + 8);
    uVar3 = (undefined4)((ulong)*(undefined8 *)((long)in_R9 + 8) >> 0x20);
  }
  uVar5 = CONCAT44(uVar3,ZVar2);
  sVar4 = *(size_t *)(in_stack_00000008 + 0xc);
  dictContentType_00 = (ZSTD_dictContentType_e)*(undefined8 *)(in_stack_00000008 + 0x14);
  dtlm_00 = *(ZSTD_dictTableLoadMethod_e *)(in_stack_00000008 + 0x1c);
  cParams.chainLog = in_stack_ffffffffffffff64;
  cParams.windowLog = dtlm_00;
  cParams._8_8_ = in_stack_ffffffffffffff68;
  cParams._16_8_ = in_stack_ffffffffffffff70;
  cParams.strategy = ZVar2;
  ZSTD_checkCParams(cParams);
  uVar1 = ZSTD_isError(0x23ae67);
  if (uVar1 != 0) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x644f,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if ((in_RSI != 0) && (in_R9 != (void *)0x0)) {
    __assert_fail("!((dict) && (cdict))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6450,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if ((((in_R9 == (void *)0x0) || (*(long *)((long)in_R9 + 8) == 0)) ||
      ((0x1ffff < in_stack_00000010 &&
       ((((ulong)(*(long *)((long)in_R9 + 8) * 6) <= in_stack_00000010 &&
         (in_stack_00000010 != 0xffffffffffffffff)) && (*(int *)((long)in_R9 + 0x17b4) != 0)))))) ||
     (*(int *)(in_stack_00000008 + 0x44) == 3)) {
    local_18 = ZSTD_resetCCtx_internal
                         ((ZSTD_CCtx *)cdict,(ZSTD_CCtx_params *)dictContentSize,in_stack_00000068,
                          in_stack_00000060,in_stack_0000005c,in_stack_00000058);
    uVar1 = ERR_isError(local_18);
    if (uVar1 == 0) {
      if (in_R9 == (void *)0x0) {
        local_18 = ZSTD_compress_insertDictionary
                             (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                              (ldmState_t *)CONCAT44(uVar3,ZVar2),in_stack_ffffffffffffff70,
                              *(ZSTD_CCtx_params **)(in_RDI + 0xda8),
                              (void *)((ulong)in_stack_ffffffffffffff64 << 0x20),sVar4,
                              dictContentType_00,dtlm_00,(ZSTD_tableFillPurpose_e)uVar5,(void *)0x0)
        ;
      }
      else {
        local_18 = ZSTD_compress_insertDictionary
                             (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                              (ldmState_t *)CONCAT44(uVar3,ZVar2),in_stack_ffffffffffffff70,
                              *(ZSTD_CCtx_params **)(in_RDI + 0xda8),
                              (void *)((ulong)in_stack_ffffffffffffff64 << 0x20),sVar4,
                              dictContentType_00,dtlm_00,(ZSTD_tableFillPurpose_e)uVar5,in_R9);
      }
      sVar4 = local_18;
      uVar1 = ERR_isError(local_18);
      if (uVar1 == 0) {
        if (0xffffffff < sVar4) {
          __assert_fail("dictID <= UINT_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x6469,
                        "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                       );
        }
        *(int *)(in_RDI + 0x280) = (int)sVar4;
        *(undefined8 *)(in_RDI + 0x288) = uVar5;
        local_18 = 0;
      }
    }
  }
  else {
    local_18 = ZSTD_resetCCtx_usingCDict
                         ((ZSTD_CCtx *)CONCAT44(in_stack_0000005c,in_stack_00000058),
                          in_stack_00000050,(ZSTD_CCtx_params *)err_code,dictID,err_code_1._4_4_);
  }
  return local_18;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    size_t const dictContentSize = cdict ? cdict->dictContentSize : dictSize;
#if ZSTD_TRACE
    cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     dictContentSize,
                                     ZSTDcrp_makeClean, zbuff) , "");
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, cdict->dictContentType, dtlm,
                        ZSTD_tfp_forCCtx, cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, ZSTD_tfp_forCCtx, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
        cctx->dictContentSize = dictContentSize;
    }
    return 0;
}